

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O0

bool UTF_U_to_u8<(char)63>(UTF_US32 *us32,UTF_US8 *us8)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  local_30;
  const_iterator end;
  const_iterator it;
  UTF_UC8 uc8 [4];
  UTF_US8 *us8_local;
  UTF_US32 *us32_local;
  
  __gnu_cxx::
  __normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  ::__normal_iterator(&end);
  local_30._M_current =
       (char32_t *)
       std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
       end(us32);
  end = std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::begin(us32);
  while (bVar1 = __gnu_cxx::operator!=(&end,&local_30), bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
             ::operator*(&end);
    bVar1 = UTF_uc32_to_uc8(*pcVar2,(UTF_UC8 *)((long)&it._M_current + 4));
    if (bVar1) {
      std::__cxx11::
      basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
      push_back(us8,it._M_current._4_1_);
      if (((it._M_current._5_1_ != '\0') &&
          (std::__cxx11::
           basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
           ::push_back(us8,it._M_current._5_1_), it._M_current._6_1_ != '\0')) &&
         (std::__cxx11::
          basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
          ::push_back(us8,it._M_current._6_1_), it._M_current._7_1_ != '\0')) {
        std::__cxx11::
        basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
        ::push_back(us8,it._M_current._7_1_);
      }
    }
    else {
      std::__cxx11::
      basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
      push_back(us8,'?');
    }
    __gnu_cxx::
    __normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::operator++(&end);
  }
  return true;
}

Assistant:

inline bool
UTF_U_to_u8(const UTF_US32& us32, UTF_US8& us8)
{
    UTF_UC8 uc8[4];
    UTF_US32::const_iterator it, end = us32.end();
    for (it = us32.begin(); it != end; ++it)
    {
        if (!UTF_uc32_to_uc8(*it, uc8))
        {
            if (!t_default_char)
                return false;

            us8.push_back(UTF_STATIC_CAST(UTF_UC8, t_default_char));
            continue;
        }

        us8.push_back(uc8[0]);
        if (uc8[1])
        {
            us8.push_back(uc8[1]);
            if (uc8[2])
            {
                us8.push_back(uc8[2]);
                if (uc8[3])
                {
                    us8.push_back(uc8[3]);
                }
            }
        }
    }

    return true;
}